

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O0

void __thiscall Decrypt::operator()(Decrypt *this,string *inputPath,ostream *os)

{
  _Ios_Openmode _Var1;
  int iVar2;
  streamoff sVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t *outlen;
  uchar *out;
  uchar *out_00;
  uchar *in_R8;
  size_t in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  ostringstream local_488 [8];
  ostringstream oss;
  int local_30c;
  int i;
  streamoff total;
  SequenceD<64> seq;
  fpos afStack_248 [7];
  char deadChars;
  pos_type size;
  istream local_228 [8];
  ifstream is;
  ostream *os_local;
  string *inputPath_local;
  Decrypt *this_local;
  
  _Var1 = std::operator|(_S_in,_S_bin);
  _Var1 = std::operator|(_Var1,_S_ate);
  std::ifstream::ifstream(local_228,(string *)inputPath,_Var1);
  std::istream::operator>>(local_228,std::noskipws);
  _afStack_248 = std::istream::tellg();
  std::istream::seekg((long)local_228,_S_beg);
  std::operator>>((istream *)local_228,
                  (char *)((long)&seq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Deque_impl_data._M_finish + 0x1f));
  SequenceD<64>::SequenceD((SequenceD<64> *)&total);
  sVar3 = std::fpos::operator_cast_to_long(afStack_248);
  outlen = (size_t *)
           (long)(int)(uint)('\0' < seq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_);
  lVar4 = sVar3 / 8 - (long)outlen;
  for (local_30c = 0; local_30c < lVar4; local_30c = local_30c + 1) {
    operator>>((istream *)local_228,(SequenceD<64> *)&total);
    iVar2 = decrypt(this,(EVP_PKEY_CTX *)&total,out,outlen,in_R8,in_R9);
    operator<<(os,(SequenceD<64> *)CONCAT44(extraout_var,iVar2));
  }
  if ('\0' < seq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node._7_1_) {
    std::__cxx11::ostringstream::ostringstream(local_488);
    operator>>((istream *)local_228,(SequenceD<64> *)&total);
    iVar2 = decrypt(this,(EVP_PKEY_CTX *)&total,out_00,outlen,in_R8,in_R9);
    operator<<((ostream *)local_488,(SequenceD<64> *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::ostringstream::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4a8,&local_4c8,0,
               (long)(8 - seq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node._7_1_));
    std::operator<<(os,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::ostringstream::~ostringstream(local_488);
  }
  std::ifstream::close();
  SequenceD<64>::~SequenceD((SequenceD<64> *)&total);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void Decrypt::operator()(const std::string &inputPath, std::ostream &os) {
    // Read input file and tell it to not ignore whitespaces while reading
    std::ifstream is(inputPath, std::ios::in | std::ios::binary | std::ios::ate);
    is >> std::noskipws;

    auto size = is.tellg();
    is.seekg(0, std::ios::beg);

    // Read the number of dead characters upfront so that we know how to truncate
    // input at the end.
    char deadChars;
    is >> deadChars;

    // Decypher each sequence in a streaming fashion
    SequenceD<64> seq;
    auto total = (size / 8) - (deadChars > 0 ? 1 : 0);
    for (auto i = 0; i < total; ++i) {
        is >> seq;
        os << decrypt(seq);
    }

    // If there is at least one dead character...
    if (deadChars > 0) {
        // Read last  sequence in a string stream
        std::ostringstream oss{};
        is >> seq;
        oss << decrypt(seq);
        // and truncate resul
        os << oss.str().substr(0, 8 - deadChars);
    }

    is.close();
}